

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

bool __thiscall Parse::SMTLIB2::parseAsSortDefinition(SMTLIB2 *this,string *id,LExpr *exp)

{
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ***pppDVar1;
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> **pppVar2;
  pointer pcVar3;
  ParseResult *pPVar4;
  LExpr *pLVar5;
  Entry *pEVar6;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  TermList TVar8;
  TermList TVar9;
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> *ppVar10;
  SortDefinition *pSVar11;
  pair<Kernel::TermList,_Kernel::TermList> val;
  ParseResult res;
  LispListReader argRdr;
  string pId;
  string local_e8;
  size_type local_c8;
  undefined8 uStack_c0;
  Term *local_b8;
  Iterator local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  LExpr *local_88;
  SortDefinition *local_80;
  Entry *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = local_98;
  pcVar3 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,pcVar3 + id->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a8,local_a0 + (long)local_a8);
  pEVar6 = ::Lib::
           DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parse::SMTLIB2::SortDefinition,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_sortDefinitions,&local_50);
  pSVar11 = &pEVar6->_val;
  if (pEVar6 == (Entry *)0x0) {
    pSVar11 = (SortDefinition *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pEVar6 != (Entry *)0x0) {
    local_88 = exp;
    local_78 = pEVar6;
    this_00 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)::Lib::FixedSizeAllocator<48UL>::alloc
                           ((FixedSizeAllocator<48UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    this_00->_timestamp = 1;
    this_00->_size = 0;
    this_00->_deleted = 0;
    this_00->_capacityIndex = 0;
    this_00->_capacity = 0;
    *(undefined8 *)&this_00->_nextExpansionOccupancy = 0;
    *(undefined8 *)((long)&this_00->_entries + 4) = 0;
    *(undefined4 *)((long)&this_00->_afterLast + 4) = 0;
    local_b0._lst = pSVar11->args;
    local_80 = pSVar11;
    if (local_b0._lst != (LExprList *)0x0) {
      do {
        pPVar4 = (this->_results)._cursor;
        if ((pPVar4 == (this->_results)._stack) ||
           ((((~(uint)pPVar4[-1].sort._content & 3) == 0 && (pPVar4[-1].formula == true)) &&
            (pPVar4[-1].field_3.frm == (Formula *)0x0)))) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"sort definition","");
          complainAboutArgShortageOrWrongSorts(this,&local_e8,local_88);
        }
        (this->_results)._cursor = pPVar4 + -1;
        local_e8._M_string_length._0_1_ = pPVar4[-1].formula;
        local_e8._M_dataplus._M_p = (pointer)pPVar4[-1].sort._content;
        local_e8.field_2._M_allocated_capacity = (size_type)pPVar4[-1].label._M_dataplus._M_p;
        paVar7 = &pPVar4[-1].label.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.field_2._M_allocated_capacity == paVar7) {
          local_c8 = paVar7->_M_allocated_capacity;
          uStack_c0 = *(undefined8 *)((long)&pPVar4[-1].label.field_2 + 8);
          local_e8.field_2._M_allocated_capacity = (size_type)&local_c8;
        }
        else {
          local_c8 = paVar7->_M_allocated_capacity;
        }
        local_e8.field_2._8_8_ = pPVar4[-1].label._M_string_length;
        pPVar4[-1].label._M_dataplus._M_p = (pointer)paVar7;
        pPVar4[-1].label._M_string_length = 0;
        pPVar4[-1].label.field_2._M_local_buf[0] = '\0';
        local_b8 = (Term *)pPVar4[-1].field_3.frm;
        pPVar4 = (this->_results)._cursor;
        pcVar3 = (pPVar4->label)._M_dataplus._M_p;
        paVar7 = &(pPVar4->label).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar7) {
          operator_delete(pcVar3,paVar7->_M_allocated_capacity + 1);
        }
        TVar8._content = (uint64_t)local_b8;
        if ((char)local_e8._M_string_length == '\x01') {
          TVar8._content = (uint64_t)Kernel::Term::createFormula((Formula *)local_b8);
          Kernel::AtomicSort::boolSort();
        }
        Kernel::AtomicSort::superSort();
        if ((size_type *)local_e8.field_2._M_allocated_capacity != &local_c8) {
          operator_delete((void *)local_e8.field_2._M_allocated_capacity,local_c8 + 1);
        }
        Shell::LispListReader::readAtom_abi_cxx11_(&local_e8,(LispListReader *)&local_b0);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p +
                   CONCAT71(local_e8._M_string_length._1_7_,(char)local_e8._M_string_length));
        TVar9 = Kernel::AtomicSort::superSort();
        val.second._content = TVar9._content;
        val.first._content = TVar8._content;
        ::Lib::
        DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::insert(this_00,&local_70,val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      } while (local_b0._lst != (LExprList *)0x0);
    }
    if ((this->_scopes)._cursor == (this->_scopes)._end) {
      ::Lib::
      Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
      ::expand(&this->_scopes);
    }
    pEVar6 = local_78;
    pSVar11 = local_80;
    *(this->_scopes)._cursor = this_00;
    pppDVar1 = &(this->_scopes)._cursor;
    *pppDVar1 = *pppDVar1 + 1;
    if ((this->_todo)._cursor == (this->_todo)._end) {
      ::Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::
      expand(&this->_todo);
    }
    ppVar10 = (this->_todo)._cursor;
    ppVar10->first = PO_POP_LOOKUP;
    ppVar10->second = (Expression *)0x0;
    ppVar10 = (this->_todo)._cursor + 1;
    (this->_todo)._cursor = ppVar10;
    pLVar5 = pSVar11->body;
    if (ppVar10 == (this->_todo)._end) {
      ::Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::
      expand(&this->_todo);
    }
    ppVar10 = (this->_todo)._cursor;
    ppVar10->first = PO_PARSE_SORT;
    ppVar10->second = pLVar5;
    pppVar2 = &(this->_todo)._cursor;
    *pppVar2 = *pppVar2 + 1;
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return pEVar6 != (Entry *)0x0;
}

Assistant:

bool SMTLIB2::parseAsSortDefinition(const std::string& id,LExpr* exp)
{
  std::string pId = id + TYPECON_POSTFIX;
  auto def = _sortDefinitions.findPtr(pId);
  if (!def) {
    return false;
  }
  TermLookup* lookup = new TermLookup();

  LispListReader argRdr(def->args);

  while (argRdr.hasNext()) {
    if (_results.isEmpty() || _results.top().isSeparator()) {
      complainAboutArgShortageOrWrongSorts("sort definition",exp);
    }
    TermList arg;
    ALWAYS(_results.pop().asTerm(arg) == AtomicSort::superSort());
    const std::string& argName = argRdr.readAtom();
    // TODO: could check if the same string names more than one argument positions
    // the following just takes the first and ignores the others
    lookup->insert(argName,make_pair(arg,AtomicSort::superSort()));
  }

  _scopes.push(lookup);

  _todo.push(make_pair(PO_POP_LOOKUP,nullptr)); //schedule lookup deletion (see above)
  _todo.push(make_pair(PO_PARSE_SORT,def->body));

  return true;
}